

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O0

int uv_fs_poll_getpath(uv_fs_poll_t *handle,char *buffer,size_t *size)

{
  void *pvVar1;
  int iVar2;
  size_t __n;
  size_t required_len;
  poll_ctx *ctx;
  size_t *size_local;
  char *buffer_local;
  uv_fs_poll_t *handle_local;
  
  iVar2 = uv_is_active((uv_handle_t *)handle);
  if (iVar2 == 0) {
    *size = 0;
    handle_local._4_4_ = -0x16;
  }
  else {
    pvVar1 = handle->poll_ctx;
    if (pvVar1 == (void *)0x0) {
      __assert_fail("ctx != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/fs-poll.c"
                    ,0x94,"int uv_fs_poll_getpath(uv_fs_poll_t *, char *, size_t *)");
    }
    __n = strlen((char *)((long)pvVar1 + 0x308));
    if (__n < *size) {
      memcpy(buffer,(void *)((long)pvVar1 + 0x308),__n);
      *size = __n;
      buffer[__n] = '\0';
      handle_local._4_4_ = 0;
    }
    else {
      *size = __n + 1;
      handle_local._4_4_ = -0x69;
    }
  }
  return handle_local._4_4_;
}

Assistant:

int uv_fs_poll_getpath(uv_fs_poll_t* handle, char* buffer, size_t* size) {
  struct poll_ctx* ctx;
  size_t required_len;

  if (!uv_is_active((uv_handle_t*)handle)) {
    *size = 0;
    return UV_EINVAL;
  }

  ctx = handle->poll_ctx;
  assert(ctx != NULL);

  required_len = strlen(ctx->path);
  if (required_len >= *size) {
    *size = required_len + 1;
    return UV_ENOBUFS;
  }

  memcpy(buffer, ctx->path, required_len);
  *size = required_len;
  buffer[required_len] = '\0';

  return 0;
}